

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::MapFind__Impl<mp::LinearFunctionalConstraint>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,LinearFunctionalConstraint *con)

{
  bool bVar1;
  pointer pvVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  const_iterator it;
  ConstraintMap<LinearFunctionalConstraint> *map;
  LinearFunctionalConstraint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_true>
  local_30 [2];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_true>
  local_20;
  ConstraintMap<LinearFunctionalConstraint> *local_18;
  
  local_18 = GetConstraintMap(in_RDI,(LinearFunctionalConstraint *)0x0);
  std::reference_wrapper<mp::LinearFunctionalConstraint_const>::
  reference_wrapper<mp::LinearFunctionalConstraint_const&,void,mp::LinearFunctionalConstraint_const*>
            ((reference_wrapper<const_mp::LinearFunctionalConstraint> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int,_std::hash<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::equal_to<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>_>_>
       ::find((unordered_map<std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int,_std::hash<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::equal_to<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>_>_>
               *)in_stack_ffffffffffffffb8,(key_type *)0x19cb89);
  local_30[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int,_std::hash<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::equal_to<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>_>_>
       ::end((unordered_map<std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int,_std::hash<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::equal_to<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>_>_>
              *)in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator!=(local_30,&local_20);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_false,_true>
                           *)0x19cbbc);
    iVar3 = pvVar2->second;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int MapFind__Impl(const Constraint& con) {
    const auto& map = GET_CONST_CONSTRAINT_MAP(Constraint);
    auto it = map.find( con );
    return (map.end() != it) ? it->second : -1;
  }